

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O0

float scasum(int n,complex<float> *x,int incx)

{
  float fVar1;
  undefined4 extraout_XMM0_Db;
  double dVar2;
  undefined4 extraout_XMM0_Db_00;
  double dVar3;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  float local_28;
  int local_24;
  float value;
  int ix;
  int i;
  int incx_local;
  complex<float> *x_local;
  int n_local;
  
  local_28 = 0.0;
  if ((n < 1) || (incx < 1)) {
    x_local._4_4_ = 0.0;
  }
  else {
    if (incx == 1) {
      for (value = 0.0; (int)value < n; value = (float)((int)value + 1)) {
        fVar1 = std::real<float>(x + (int)value);
        dVar2 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar1));
        fVar1 = std::imag<float>(x + (int)value);
        dVar3 = std::fabs((double)CONCAT44(extraout_XMM0_Db_00,fVar1));
        local_28 = local_28 + SUB84(dVar2,0) + SUB84(dVar3,0);
      }
    }
    else {
      local_24 = 0;
      for (value = 0.0; (int)value < n; value = (float)((int)value + 1)) {
        fVar1 = std::real<float>(x + local_24);
        dVar2 = std::fabs((double)CONCAT44(extraout_XMM0_Db_01,fVar1));
        fVar1 = std::imag<float>(x + local_24);
        dVar3 = std::fabs((double)CONCAT44(extraout_XMM0_Db_02,fVar1));
        local_28 = local_28 + SUB84(dVar2,0) + SUB84(dVar3,0);
        local_24 = local_24 + incx;
      }
    }
    x_local._4_4_ = local_28;
  }
  return x_local._4_4_;
}

Assistant:

float scasum ( int n, complex <float> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    SCASUM takes the sum of the absolute values of a vector.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <float> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, float SCASUM, the sum of the absolute values.
//
{
  int i;
  int ix;
  float value;

  value = 0.0;

  if ( n <= 0 || incx <= 0 )
  {
    return value;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + fabs ( real ( x[i] ) )
                    + fabs ( imag ( x[i] ) );
    }
  }
  else
  {
    ix = 0;
    for ( i = 0; i < n; i++ )
    {
      value = value + fabs ( real ( x[ix] ) )
                    + fabs ( imag ( x[ix] ) );
      ix = ix + incx;
    }
  }
  return value;
}